

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * QString::number(double n,char format,int precision)

{
  char cVar1;
  undefined4 in_EDX;
  char in_SIL;
  QString *in_RDI;
  undefined8 in_XMM0_Qa;
  DoubleForm form;
  undefined1 in_stack_ffffffffffffffbf;
  undefined4 local_1c;
  
  local_1c = 1;
  cVar1 = QtMiscUtils::toAsciiLower('\0');
  if (cVar1 == 'e') {
    local_1c = 0;
  }
  else if (cVar1 == 'f') {
    local_1c = 1;
  }
  else if (cVar1 == 'g') {
    local_1c = 2;
  }
  QtMiscUtils::isAsciiUpper((int)in_SIL);
  qdtoBasicLatin((double)CONCAT44(in_EDX,local_1c),(DoubleForm)((ulong)in_XMM0_Qa >> 0x20),
                 (int)in_XMM0_Qa,(bool)in_stack_ffffffffffffffbf);
  return in_RDI;
}

Assistant:

QString QString::number(double n, char format, int precision)
{
    QLocaleData::DoubleForm form = QLocaleData::DFDecimal;

    switch (QtMiscUtils::toAsciiLower(format)) {
        case 'f':
            form = QLocaleData::DFDecimal;
            break;
        case 'e':
            form = QLocaleData::DFExponent;
            break;
        case 'g':
            form = QLocaleData::DFSignificantDigits;
            break;
        default:
#if defined(QT_CHECK_RANGE)
            qWarning("QString::setNum: Invalid format char '%c'", format);
#endif
            break;
    }

    return qdtoBasicLatin(n, form, precision, isAsciiUpper(format));
}